

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2crossing_edge_query.cc
# Opt level: O2

void __thiscall
S2CrossingEdgeQuery::GetCandidates
          (S2CrossingEdgeQuery *this,S2Point *a0,S2Point *a1,S2Shape *shape,
          vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_> *edges)

{
  pointer pSVar1;
  int iVar2;
  __normal_iterator<s2shapeutil::ShapeEdgeId_*,_std::vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>_>
  __first;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  pSVar1 = (edges->
           super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((edges->
      super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>).
      _M_impl.super__Vector_impl_data._M_finish != pSVar1) {
    (edges->super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>)
    ._M_impl.super__Vector_impl_data._M_finish = pSVar1;
  }
  iVar2 = (*shape->_vptr_S2Shape[2])(shape);
  if (iVar2 < 0x1c) {
    std::vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>::reserve
              (edges,(long)iVar2);
  }
  local_48._8_8_ = 0;
  local_30 = std::
             _Function_handler<bool_(const_s2shapeutil::ShapeEdgeId_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2crossing_edge_query.cc:141:37)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<bool_(const_s2shapeutil::ShapeEdgeId_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2crossing_edge_query.cc:141:37)>
             ::_M_manager;
  local_48._M_unused._M_object = edges;
  VisitRawCandidates(this,a0,a1,shape,(ShapeEdgeIdVisitor *)&local_48);
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  if (8 < (ulong)((long)(edges->
                        super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(edges->
                       super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>
                       )._M_impl.super__Vector_impl_data._M_start)) {
    std::
    __sort<__gnu_cxx::__normal_iterator<s2shapeutil::ShapeEdgeId*,std::vector<s2shapeutil::ShapeEdgeId,std::allocator<s2shapeutil::ShapeEdgeId>>>,__gnu_cxx::__ops::_Iter_less_iter>
              ();
    __first = std::
              __unique<__gnu_cxx::__normal_iterator<s2shapeutil::ShapeEdgeId*,std::vector<s2shapeutil::ShapeEdgeId,std::allocator<s2shapeutil::ShapeEdgeId>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                        ((edges->
                         super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>
                         )._M_impl.super__Vector_impl_data._M_start,
                         (edges->
                         super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>
                         )._M_impl.super__Vector_impl_data._M_finish);
    std::vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>::erase
              (edges,(const_iterator)__first._M_current,
               (edges->
               super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>
               )._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void S2CrossingEdgeQuery::GetCandidates(const S2Point& a0, const S2Point& a1,
                                        const S2Shape& shape,
                                        vector<ShapeEdgeId>* edges) {
  edges->clear();
  int num_edges = shape.num_edges();
  if (num_edges <= kMaxBruteForceEdges) {
    edges->reserve(num_edges);
  }
  VisitRawCandidates(a0, a1, shape, [edges](ShapeEdgeId id) {
      edges->push_back(id);
      return true;
    });
  if (edges->size() > 1) {
    std::sort(edges->begin(), edges->end());
    edges->erase(std::unique(edges->begin(), edges->end()), edges->end());
  }
}